

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int bb_serial_read(uint user_gpio,void *buf,size_t bufSize)

{
  int iVar1;
  undefined8 in_RDX;
  int in_ESI;
  int bytes;
  int in_stack_00000fe8;
  int in_stack_00000fec;
  void *in_stack_00000ff0;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  iVar1 = pigpio_command(in_ESI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,in_stack_ffffffffffffffe4,
                         in_stack_ffffffffffffffe0);
  if (0 < iVar1) {
    iVar1 = recvMax(in_stack_00000ff0,in_stack_00000fec,in_stack_00000fe8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return iVar1;
}

Assistant:

int bb_serial_read(unsigned user_gpio, void *buf, size_t bufSize)
{
   int bytes;

   bytes = pigpio_command(gPigCommand, PI_CMD_SLR, user_gpio, bufSize, 0);

   if (bytes > 0)
   {
      bytes = recvMax(buf, bufSize, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}